

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O1

void If_ManCreateChoice(If_Man_t *p,If_Obj_t *pObj)

{
  If_Obj_t *pIVar1;
  uint uVar2;
  uint uVar3;
  
  if (-1 < (char)*(uint *)pObj) {
    *(uint *)pObj = *(uint *)pObj | 0x80;
    pIVar1 = pObj;
    do {
      uVar2 = *(uint *)pObj >> 0xd;
      uVar3 = *(uint *)pIVar1 >> 0xd;
      if (*(uint *)pIVar1 >> 0xd < uVar2) {
        uVar3 = uVar2;
      }
      *(uint *)pObj = *(uint *)pObj & 0x1fff | uVar3 << 0xd;
      pIVar1->nVisits = pIVar1->nVisits + 1;
      pIVar1->nVisitsCopy = pIVar1->nVisitsCopy + 1;
      pIVar1 = pIVar1->pEquiv;
    } while (pIVar1 != (If_Obj_t *)0x0);
    if (p->nLevelMax < (int)(*(uint *)pObj >> 0xd)) {
      p->nLevelMax = *(uint *)pObj >> 0xd;
    }
    p->nChoices = p->nChoices + 1;
    return;
  }
  __assert_fail("pObj->fRepr == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                ,0x1ce,"void If_ManCreateChoice(If_Man_t *, If_Obj_t *)");
}

Assistant:

void If_ManCreateChoice( If_Man_t * p, If_Obj_t * pObj )
{
    If_Obj_t * pTemp;
    // mark the node as a representative if its class
    assert( pObj->fRepr == 0 );
    pObj->fRepr = 1;
    // update the level of this node (needed for correct required time computation)
    for ( pTemp = pObj; pTemp; pTemp = pTemp->pEquiv )
    {
        pObj->Level = IF_MAX( pObj->Level, pTemp->Level );
        pTemp->nVisits++; pTemp->nVisitsCopy++;
    }
    // mark the largest level
    if ( p->nLevelMax < (int)pObj->Level )
        p->nLevelMax = (int)pObj->Level;
    p->nChoices++;
}